

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::(anonymous_namespace)::generateToVec4Expression_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Attribute *attrib,int id)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string variableName;
  ostringstream src;
  int local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  AttribType local_1c0;
  ostream local_198;
  
  local_224 = (int)attrib;
  iVar1 = *(int *)(this + 0x78);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_200);
  }
  else {
    de::toString<int>(&local_1e0,&local_224);
    std::operator+(&local_200,"[",&local_1e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                   &local_200,"]");
  }
  std::operator+(&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  if (iVar1 != -1) {
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  AttributeLocationTestUtil::AttribType::AttribType(&local_1c0,(AttribType *)this);
  std::__cxx11::string::~string((string *)&local_1c0);
  switch(local_1c0.m_glTypeEnum) {
  case 0x8b51:
  case 0x8b54:
switchD_0151919a_caseD_8b51:
    poVar2 = std::operator<<(&local_198,"vec4(");
    poVar2 = std::operator<<(poVar2,(string *)&local_220);
    poVar2 = std::operator<<(poVar2,".xyz, ");
    poVar2 = std::operator<<(poVar2,(string *)&local_220);
    pcVar3 = ".x)";
    break;
  case 0x8b52:
switchD_0151919a_caseD_8b52:
    poVar2 = std::operator<<(&local_198,"vec4(");
    poVar2 = std::operator<<(poVar2,(string *)&local_220);
    pcVar3 = ")";
    break;
  default:
    if (local_1c0.m_glTypeEnum != 0x8dc6) {
      if (local_1c0.m_glTypeEnum != 0x8dc7) goto switchD_0151919a_caseD_8b52;
      goto switchD_0151919a_caseD_8b51;
    }
  case 0x8b50:
  case 0x8b53:
    poVar2 = std::operator<<(&local_198,"vec4(");
    poVar2 = std::operator<<(poVar2,(string *)&local_220);
    poVar2 = std::operator<<(poVar2,".xy, ");
    poVar2 = std::operator<<(poVar2,(string *)&local_220);
    pcVar3 = ".yx)";
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::__cxx11::string::~string((string *)&local_220);
  return __return_storage_ptr__;
}

Assistant:

string generateToVec4Expression (const Attribute& attrib, int id=-1)
{
	const string		variableName(attrib.getName() + (attrib.getArraySize() != Attribute::NOT_ARRAY ? "[" + de::toString(id) + "]" : ""));
	std::ostringstream	src;

	switch (attrib.getType().getGLTypeEnum())
	{
		case GL_INT_VEC2:
		case GL_UNSIGNED_INT_VEC2:
		case GL_FLOAT_VEC2:
			src << "vec4(" << variableName << ".xy, " << variableName << ".yx)";
			break;

		case GL_INT_VEC3:
		case GL_UNSIGNED_INT_VEC3:
		case GL_FLOAT_VEC3:
			src << "vec4(" << variableName << ".xyz, " << variableName << ".x)";
			break;

		default:
			src << "vec4(" << variableName << ")";
			break;
	}

	return src.str();
}